

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.cpp
# Opt level: O1

void timestamps(void)

{
  r[0].type = 't';
  l[0].type = 't';
  l[0].val.d = 2.12196341187911e-314;
  r[0].val.d = 9.88131291682493e-324;
  cmp_gt(l,r,1,1,(rtosc_cmp_options *)0x0,"future","nearly epoch",0x9b);
  l[0].val.d = 0.0;
  r[0].val.d = 4.94065645841247e-324;
  cmp_gt(l,r,1,1,(rtosc_cmp_options *)0x0,"immediately","epoch",0x9f);
  l[0].val.d = 2.12199579047121e-314;
  cmp_gt(l,r,1,1,(rtosc_cmp_options *)0x0,"immediately","future",0xa2);
  return;
}

Assistant:

void timestamps()
{
    l[0].type = r[0].type = 't';
    l[0].val.t = 0xFFFF0000;
    r[0].val.t = 0x00000002;

    cmp_gt(l, r, 1, 1, NULL, "future", "nearly epoch", __LINE__);

    l[0].val.t = 0; // epoch
    r[0].val.t = 1; // immediately
    cmp_gt(l, r, 1, 1, NULL, "immediately", "epoch", __LINE__);

    l[0].val.t = 0xFFFFFFFF; // future
    cmp_gt(l, r, 1, 1, NULL, "immediately", "future", __LINE__);
}